

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deTimer.c
# Opt level: O3

deBool deTimer_scheduleInterval(deTimer *timer,int milliseconds)

{
  int iVar1;
  deBool dVar2;
  itimerspec tspec;
  itimerspec local_30;
  
  dVar2 = 0;
  if (timer->isActive == 0) {
    local_30.it_interval.tv_sec = (__time_t)(milliseconds / 1000);
    local_30.it_interval.tv_nsec = (long)((milliseconds % 1000) * 1000);
    dVar2 = 0;
    local_30.it_value.tv_sec = local_30.it_interval.tv_sec;
    local_30.it_value.tv_nsec = local_30.it_interval.tv_nsec;
    iVar1 = timer_settime(timer->timer,0,&local_30,(itimerspec *)0x0);
    if (iVar1 == 0) {
      timer->isActive = 1;
      dVar2 = 1;
    }
  }
  return dVar2;
}

Assistant:

deBool deTimer_scheduleInterval (deTimer* timer, int milliseconds)
{
	struct itimerspec tspec;

	DE_ASSERT(timer && milliseconds > 0);

	if (timer->isActive)
		return DE_FALSE;

	tspec.it_value.tv_sec		= milliseconds / 1000;
	tspec.it_value.tv_nsec		= (milliseconds % 1000) * 1000;
	tspec.it_interval.tv_sec	= tspec.it_value.tv_sec;
	tspec.it_interval.tv_nsec	= tspec.it_value.tv_nsec;

	if (timer_settime(timer->timer, 0, &tspec, DE_NULL) != 0)
		return DE_FALSE;

	timer->isActive = DE_TRUE;
	return DE_TRUE;
}